

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void fill_MPP_FMT_RGB101010(RK_U8 *p,RK_U32 R,RK_U32 G,RK_U32 B,RK_U32 be)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  
  uVar1 = (R & 0xff) << 0x16;
  iVar4 = (G & 0xff) << 0xc;
  bVar3 = (byte)((uint)iVar4 >> 0x10) | (byte)(uVar1 >> 0x10);
  uVar2 = B << 2;
  bVar5 = (byte)(uVar2 >> 8) & 3 | (byte)((uint)iVar4 >> 8);
  if (be == 0) {
    uVar7 = uVar1 >> 0x18;
    bVar6 = bVar5;
  }
  else {
    uVar7 = uVar2;
    uVar2 = uVar1 >> 0x18;
    bVar6 = bVar3;
    bVar3 = bVar5;
  }
  *p = (RK_U8)uVar2;
  p[1] = bVar6;
  p[2] = bVar3;
  p[3] = (RK_U8)uVar7;
  return;
}

Assistant:

static void fill_MPP_FMT_RGB101010(RK_U8 *p, RK_U32 R, RK_U32 G, RK_U32 B, RK_U32 be)
{
    // MPP_FMT_RGB101010
    // 32 bit pixel     MSB  -------->  LSB
    //                 (00rr,rrrr,rrrr,gggg,gggg,ggbb,bbbb,bbbb)
    // big    endian   |  byte 0 |  byte 1 |  byte 2 |  byte 3 |
    // little endian   |  byte 3 |  byte 2 |  byte 1 |  byte 0 |
    RK_U32 val = (((R * 4) & 0x3ff) << 20) |
                 (((G * 4) & 0x3ff) << 10) |
                 (((B * 4) & 0x3ff) <<  0);
    if (be) {
        p[0] = (val >> 24) & 0xff;
        p[1] = (val >> 16) & 0xff;
        p[2] = (val >>  8) & 0xff;
        p[3] = (val >>  0) & 0xff;
    } else {
        p[0] = (val >>  0) & 0xff;
        p[1] = (val >>  8) & 0xff;
        p[2] = (val >> 16) & 0xff;
        p[3] = (val >> 24) & 0xff;
    }
}